

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O1

void __thiscall CLayerTiles::Shift(CLayerTiles *this,int Direction)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  switch(Direction) {
  case 1:
    if (0 < this->m_Height) {
      iVar4 = 0;
      do {
        lVar3 = (long)(this->m_Width * iVar4);
        mem_move(this->m_pTiles + lVar3,this->m_pTiles + lVar3 + 1,this->m_Width * 4 - 4);
        iVar4 = iVar4 + 1;
      } while (iVar4 < this->m_Height);
    }
    break;
  case 2:
    if (0 < this->m_Height) {
      iVar4 = 0;
      do {
        lVar3 = (long)(this->m_Width * iVar4);
        mem_move(this->m_pTiles + lVar3 + 1,this->m_pTiles + lVar3,this->m_Width * 4 - 4);
        iVar4 = iVar4 + 1;
      } while (iVar4 < this->m_Height);
    }
    break;
  case 4:
    if (1 < this->m_Height) {
      iVar4 = 0;
      do {
        iVar1 = this->m_Width;
        iVar2 = iVar1 * iVar4;
        iVar4 = iVar4 + 1;
        mem_copy(this->m_pTiles + iVar2,this->m_pTiles + iVar1 * iVar4,iVar1 << 2);
      } while (iVar4 < this->m_Height + -1);
    }
    break;
  case 8:
    if (1 < this->m_Height) {
      iVar4 = this->m_Height + 1;
      do {
        iVar1 = this->m_Width;
        mem_copy(this->m_pTiles + (iVar4 + -2) * iVar1,this->m_pTiles + (iVar4 + -3) * iVar1,
                 iVar1 << 2);
        iVar4 = iVar4 + -1;
      } while (2 < iVar4);
    }
  }
  s_lastBrushX = -1;
  s_lastBrushY = -1;
  return;
}

Assistant:

void CLayerTiles::Shift(int Direction)
{
	switch(Direction)
	{
	case 1:
		{
			// left
			for(int y = 0; y < m_Height; ++y)
				mem_move(&m_pTiles[y*m_Width], &m_pTiles[y*m_Width+1], (m_Width-1)*sizeof(CTile));
		}
		break;
	case 2:
		{
			// right
			for(int y = 0; y < m_Height; ++y)
				mem_move(&m_pTiles[y*m_Width+1], &m_pTiles[y*m_Width], (m_Width-1)*sizeof(CTile));
		}
		break;
	case 4:
		{
			// up
			for(int y = 0; y < m_Height-1; ++y)
				mem_copy(&m_pTiles[y*m_Width], &m_pTiles[(y+1)*m_Width], m_Width*sizeof(CTile));
		}
		break;
	case 8:
		{
			// down
			for(int y = m_Height-1; y > 0; --y)
				mem_copy(&m_pTiles[y*m_Width], &m_pTiles[(y-1)*m_Width], m_Width*sizeof(CTile));
		}
	}

	s_lastBrushX = -1;
	s_lastBrushY = -1;
}